

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test *this)

{
  undefined4 *puVar1;
  int x;
  AssertionResult iutest_ar;
  AssertionResult ar;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 2;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

IUTEST(SyntaxTest, ExceptionValueNE)
{
    if( int x = 1 )
        IUTEST_ASSERT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_THROW_VALUE_NE(throw 2, int, x) << x;
}